

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roman_int.cpp
# Opt level: O0

uint32_t get_I(istream *is)

{
  istream *piVar1;
  bool local_5d;
  allocator<char> local_49;
  string local_48;
  uint local_24;
  char local_1d;
  uint32_t repeats;
  char ch;
  istream *piStack_18;
  uint32_t num;
  istream *is_local;
  
  repeats = 0;
  local_24 = 0;
  piStack_18 = is;
  while( true ) {
    local_5d = false;
    if (local_24 < 3) {
      piVar1 = std::operator>>(piStack_18,&local_1d);
      local_5d = std::ios::operator_cast_to_bool
                           ((ios *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18)));
    }
    if (local_5d == false) break;
    if (local_1d == 'I') {
      repeats = repeats + 1;
      local_24 = local_24 + 1;
    }
    else if (local_1d == 'V') {
      if (local_24 != 0) {
        return repeats + 3;
      }
      repeats = repeats + 5;
    }
    else {
      if (local_1d == 'X') {
        return repeats + 8;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Invalid roman numeral.",&local_49);
      error(&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
    }
  }
  return repeats;
}

Assistant:

uint32_t get_I(std::istream& is)
{
	uint32_t num{ 0 };
	char ch;
	uint32_t repeats{ 0 };
	while (repeats < Roman_int::max_repeating_numerals && is >> ch)
	{
		switch (ch)
		{
		case 'X':
			return num + 8;
		case 'V':
		{
			if (repeats > 0)
			{
				return num + 3;
			}
			else
			{
				num += 5;
			}
			break;
		}
		case 'I':
		{
			num += 1;
			++repeats;
			break;
		}
		default:
			error("Invalid roman numeral.");
		}
	}
	return num;
}